

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
               (string_t *adata,timestamp_t *bdata,timestamp_t *cdata,long *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,
               _func_long_string_t_timestamp_t_timestamp_t_ValidityMask_ptr_unsigned_long *fun)

{
  bool bVar1;
  unsigned_long uVar2;
  long lVar3;
  unsigned_long uVar4;
  idx_t row_idx;
  unsigned_long uVar5;
  idx_t row_idx_00;
  idx_t row_idx_01;
  idx_t i;
  unsigned_long uVar6;
  idx_t row_idx_02;
  string_t sVar7;
  string_t sVar8;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar6;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar2 = (unsigned_long)asel->sel_vector[uVar6];
      }
      uVar4 = uVar6;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar4 = (unsigned_long)bsel->sel_vector[uVar6];
      }
      uVar5 = uVar6;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar5 = (unsigned_long)csel->sel_vector[uVar6];
      }
      sVar7.value.pointer.ptr = adata[uVar2].value.pointer.ptr;
      sVar7.value._0_8_ = *(undefined8 *)&adata[uVar2].value;
      lVar3 = (*fun)(sVar7,(timestamp_t)bdata[uVar4].value,(timestamp_t)cdata[uVar5].value,
                     result_validity,uVar6);
      result_data[uVar6] = lVar3;
    }
  }
  else {
    for (row_idx_02 = 0; count != row_idx_02; row_idx_02 = row_idx_02 + 1) {
      row_idx_00 = row_idx_02;
      if (asel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)asel->sel_vector[row_idx_02];
      }
      row_idx_01 = row_idx_02;
      if (bsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)bsel->sel_vector[row_idx_02];
      }
      row_idx = row_idx_02;
      if (csel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)csel->sel_vector[row_idx_02];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar1) goto LAB_006b61d5;
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (!bVar1) goto LAB_006b61d5;
        sVar8.value.pointer.ptr = adata[row_idx_00].value.pointer.ptr;
        sVar8.value._0_8_ = *(undefined8 *)&adata[row_idx_00].value;
        lVar3 = (*fun)(sVar8,(timestamp_t)bdata[row_idx_01].value,(timestamp_t)cdata[row_idx].value,
                       result_validity,row_idx_02);
        result_data[row_idx_02] = lVar3;
      }
      else {
LAB_006b61d5:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_02);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}